

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_complicatedMultiplicationFactorUnits_Test::TestBody
          (Units_complicatedMultiplicationFactorUnits_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  char *pcVar3;
  double local_130;
  AssertionResult gtest_ar;
  double local_108 [4];
  allocator<char> local_e2;
  allocator<char> local_e1;
  ModelPtr model;
  UnitsPtr bunch_of_bananas;
  UnitsPtr incredible_pile_of_square_apples;
  UnitsPtr u4;
  UnitsPtr apple;
  UnitsPtr u3;
  UnitsPtr u2;
  UnitsPtr square_apple;
  UnitsPtr u1;
  UnitsPtr banana;
  UnitsPtr bushell_of_apples;
  UnitsPtr u;
  
  libcellml::Model::create();
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u",(allocator<char> *)local_108);
  libcellml::NamedEntity::setName
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar2 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"u",(allocator<char> *)&u2)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"milli",(allocator<char> *)&u3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bunch_of_bananas,"",(allocator<char> *)&u4);
  libcellml::Units::addUnit((string *)peVar2,(string *)&gtest_ar,2.0,1000.0,(string *)local_108);
  std::__cxx11::string::~string((string *)&bunch_of_bananas);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"dimensionless",(allocator<char> *)local_108);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u2",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar2 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"u",(allocator<char> *)&u3)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"kilo",(allocator<char> *)&u4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bunch_of_bananas,"",(allocator<char> *)&apple);
  libcellml::Units::addUnit((string *)peVar2,(string *)&gtest_ar,2.0,0.001,(string *)local_108);
  std::__cxx11::string::~string((string *)&bunch_of_bananas);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"dimensionless",(allocator<char> *)local_108);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u3",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&u3);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"u",(allocator<char> *)&u4)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"kilo",(allocator<char> *)&apple);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bunch_of_bananas,"",(allocator<char> *)&banana);
  libcellml::Units::addUnit
            ((string *)u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,4.0,0.001,(string *)local_108);
  std::__cxx11::string::~string((string *)&bunch_of_bananas);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u4",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&u4);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u2",(allocator<char> *)&bunch_of_bananas);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"",(allocator<char> *)&apple);
  libcellml::Units::addUnit
            ((string *)u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             2.0,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"apple",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&apple);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"banana",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&banana);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"bushell_of_apples",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&bushell_of_apples);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"apple",(allocator<char> *)&square_apple);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"mega",(allocator<char> *)&incredible_pile_of_square_apples);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bunch_of_bananas,"",(allocator<char> *)&local_130);
  libcellml::Units::addUnit
            ((string *)
             bushell_of_apples.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(string *)&gtest_ar,1.0,1000.0,(string *)local_108);
  std::__cxx11::string::~string((string *)&bunch_of_bananas);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"square_apple",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&square_apple);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"apple",(allocator<char> *)&bunch_of_bananas);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"",(allocator<char> *)&incredible_pile_of_square_apples);
  libcellml::Units::addUnit
            ((string *)
             square_apple.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             2.0,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"incredible_pile_of_square_apples",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&incredible_pile_of_square_apples);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"square_apple",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"mega",&local_e2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&bunch_of_bananas,"",&local_e1);
  libcellml::Units::addUnit
            ((string *)
             incredible_pile_of_square_apples.
             super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,1.0,100.0,(string *)local_108);
  std::__cxx11::string::~string((string *)&bunch_of_bananas);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"bunch_of_bananas",(allocator<char> *)local_108);
  libcellml::Units::create((string *)&bunch_of_bananas);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"banana",(allocator<char> *)&local_130);
  pcVar3 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"",&local_e2);
  libcellml::Units::addUnit
            ((string *)
             bunch_of_bananas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(int)&gtest_ar,1.0,1.0,(string *)0x1);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model",(allocator<char> *)local_108);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_108[0] = 1.0;
  local_130 = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","libcellml::Units::scalingFactor(u1, u2)",local_108,
             &local_130);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_108);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x521,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_108[0] = 1.0;
  local_130 = (double)libcellml::Units::scalingFactor((shared_ptr *)&u3,(shared_ptr *)&u4,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","libcellml::Units::scalingFactor(u3, u4)",local_108,
             &local_130);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x522,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_108[0] = 1e-08;
  local_130 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)&incredible_pile_of_square_apples,
                                 (shared_ptr *)&square_apple,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1e-08",
             "libcellml::Units::scalingFactor(incredible_pile_of_square_apples, square_apple)",
             local_108,&local_130);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x523,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_108[0] = 0.0;
  local_130 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)&incredible_pile_of_square_apples,
                                 (shared_ptr *)&bunch_of_bananas,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0",
             "libcellml::Units::scalingFactor(incredible_pile_of_square_apples, bunch_of_bananas)",
             local_108,&local_130);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x525,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bunch_of_bananas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&incredible_pile_of_square_apples.
              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&square_apple.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bushell_of_apples.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&banana.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&apple.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, complicatedMultiplicationFactorUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create("u1");
    u1->addUnit("u", "milli", 2.0, 1000.0); // u1 = u^2
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create("u2");
    u2->addUnit("u", "kilo", 2.0, 0.001); // u2 = u^2
    u2->addUnit("dimensionless");

    libcellml::UnitsPtr u3 = libcellml::Units::create("u3");
    u3->addUnit("u", "kilo", 4.0, 0.001); // u3 = u^4

    libcellml::UnitsPtr u4 = libcellml::Units::create("u4");
    u4->addUnit("u2", 2.0); // u4 = u^4

    libcellml::UnitsPtr apple = libcellml::Units::create("apple");
    libcellml::UnitsPtr banana = libcellml::Units::create("banana");

    libcellml::UnitsPtr bushell_of_apples = libcellml::Units::create("bushell_of_apples");
    bushell_of_apples->addUnit("apple", "mega", 1.0, 1000.0); // 1000*mega*apple^1

    libcellml::UnitsPtr square_apple = libcellml::Units::create("square_apple");
    square_apple->addUnit("apple", 2.0);

    libcellml::UnitsPtr incredible_pile_of_square_apples = libcellml::Units::create("incredible_pile_of_square_apples");
    incredible_pile_of_square_apples->addUnit("square_apple", "mega", 1.0, 100.0);

    libcellml::UnitsPtr bunch_of_bananas = libcellml::Units::create("bunch_of_bananas");
    bunch_of_bananas->addUnit("banana", 1, 1.0, 1.0); // 10 bananas

    model->setName("model");
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(u4);
    model->addUnits(bushell_of_apples);
    model->addUnits(apple);
    model->addUnits(banana);
    model->addUnits(square_apple);
    model->addUnits(incredible_pile_of_square_apples);
    model->addUnits(bunch_of_bananas);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u3, u4));
    EXPECT_EQ(1e-08, libcellml::Units::scalingFactor(incredible_pile_of_square_apples, square_apple));
    // Incompatible units so we return a scaling factor of 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(incredible_pile_of_square_apples, bunch_of_bananas));
}